

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::UdpInputPortDeclSyntax::UdpInputPortDeclSyntax
          (UdpInputPortDeclSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *names)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  IdentifierNameSyntax *pIVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range2;
  iterator __begin2;
  iterator_base<slang::syntax::IdentifierNameSyntax_*> local_30;
  
  uVar5 = keyword._0_8_;
  UdpPortDeclSyntax::UdpPortDeclSyntax(&this->super_UdpPortDeclSyntax,UdpInputPortDecl,attributes);
  (this->keyword).kind = (short)uVar5;
  (this->keyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->keyword).info = keyword.info;
  SVar2 = (names->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(names->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->names).super_SyntaxListBase.super_SyntaxNode.parent =
       (names->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->names).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->names).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->names).super_SyntaxListBase.childCount = (names->super_SyntaxListBase).childCount;
  (this->names).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00473340;
  sVar1 = (names->elements).size_;
  (this->names).elements.data_ = (names->elements).data_;
  (this->names).elements.size_ = sVar1;
  (this->names).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_30.index = 0;
  sVar1 = (this->names).elements.size_;
  local_30.list = &this->names;
  for (; (local_30.list != &this->names || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pIVar4 = SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
             iterator_base<slang::syntax::IdentifierNameSyntax_*>::operator*(&local_30);
    (pIVar4->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

UdpInputPortDeclSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<IdentifierNameSyntax>& names) :
        UdpPortDeclSyntax(SyntaxKind::UdpInputPortDecl, attributes), keyword(keyword), names(names) {
        this->names.parent = this;
        for (auto child : this->names)
            child->parent = this;
    }